

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::AddInputCharacter(ImGuiIO *this,uint c)

{
  ImGuiInputEvent e;
  ImGuiInputEvent local_18;
  
  if (c != 0) {
    local_18.AddedByTestEngine = false;
    local_18._21_3_ = 0;
    local_18.field_2._4_8_ = 0;
    local_18.Type = ImGuiInputEventType_Text;
    local_18.Source = ImGuiInputSource_Keyboard;
    local_18.field_2.MouseButton.Button = c;
    ImVector<ImGuiInputEvent>::push_back(&GImGui->InputEventsQueue,&local_18);
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharacter(unsigned int c)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    if (c == 0)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Text;
    e.Source = ImGuiInputSource_Keyboard;
    e.Text.Char = c;
    g.InputEventsQueue.push_back(e);
}